

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uniset.cpp
# Opt level: O1

UMatchDegree __thiscall
icu_63::UnicodeSet::matches
          (UnicodeSet *this,Replaceable *text,int32_t *offset,int32_t limit,UBool incremental)

{
  short sVar1;
  uint uVar2;
  bool bVar3;
  UBool UVar4;
  UMatchDegree UVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  int32_t iVar9;
  UnicodeString *s;
  char cVar10;
  char16_t *pcVar11;
  char16_t cVar12;
  int32_t iVar13;
  uint uVar14;
  UVector *this_00;
  int index;
  int local_50;
  
  uVar2 = *offset;
  if (uVar2 == limit) {
    UVar4 = contains(this,0xffff);
    if (UVar4 == '\0') {
      UVar5 = U_MISMATCH;
    }
    else {
      UVar5 = (incremental == '\0') + U_PARTIAL_MATCH;
    }
    return UVar5;
  }
  if (this->strings->count != 0) {
    iVar6 = (*(text->super_UObject)._vptr_UObject[9])(text,(ulong)uVar2);
    this_00 = this->strings;
    if (this_00->count < 1) {
      local_50 = 0;
    }
    else {
      index = 0;
      local_50 = 0;
      do {
        s = (UnicodeString *)UVector::elementAt(this_00,index);
        uVar8 = 0;
        if (limit <= (int)uVar2) {
          sVar1 = (s->fUnion).fStackFields.fLengthAndFlags;
          if (sVar1 < 0) {
            iVar7 = (s->fUnion).fFields.fLength;
          }
          else {
            iVar7 = (int)sVar1 >> 5;
          }
          uVar8 = iVar7 - 1;
        }
        sVar1 = (s->fUnion).fStackFields.fLengthAndFlags;
        if (sVar1 < 0) {
          uVar14 = (s->fUnion).fFields.fLength;
        }
        else {
          uVar14 = (int)sVar1 >> 5;
        }
        cVar12 = L'\xffff';
        if (uVar8 < uVar14) {
          if (((int)sVar1 & 2U) == 0) {
            pcVar11 = (s->fUnion).fFields.fArray;
          }
          else {
            pcVar11 = (char16_t *)((long)&s->fUnion + 2);
          }
          cVar12 = pcVar11[(int)uVar8];
        }
        if (((limit <= (int)uVar2) || (cVar10 = '\x02', (ushort)cVar12 <= (ushort)(char16_t)iVar6))
           && (cVar10 = '\x04', cVar12 == (char16_t)iVar6)) {
          iVar9 = matchRest(text,*offset,limit,s);
          if (incremental != '\0') {
            iVar7 = *offset - limit;
            if ((int)uVar2 < limit) {
              iVar7 = limit - *offset;
            }
            cVar10 = '\x01';
            if (iVar9 == iVar7) goto LAB_002e8c3a;
          }
          sVar1 = (s->fUnion).fStackFields.fLengthAndFlags;
          if (sVar1 < 0) {
            iVar13 = (s->fUnion).fFields.fLength;
          }
          else {
            iVar13 = (int)sVar1 >> 5;
          }
          cVar10 = '\0';
          if (iVar9 == iVar13) {
            iVar7 = local_50;
            if (local_50 < iVar9) {
              iVar7 = iVar9;
            }
            cVar10 = (local_50 <= iVar9 || limit <= (int)uVar2) * '\x02' + '\x02';
            local_50 = iVar7;
          }
        }
LAB_002e8c3a:
        if ((cVar10 != '\0') && (cVar10 != '\x04')) {
          if (cVar10 != '\x02') {
            bVar3 = false;
            goto LAB_002e8c9f;
          }
          break;
        }
        index = index + 1;
        this_00 = this->strings;
      } while (index < this_00->count);
    }
    if (local_50 == 0) {
      bVar3 = true;
LAB_002e8c9f:
      UVar5 = U_PARTIAL_MATCH;
    }
    else {
      iVar6 = -local_50;
      if ((int)uVar2 < limit) {
        iVar6 = local_50;
      }
      *offset = *offset + iVar6;
      UVar5 = U_MATCH;
      bVar3 = false;
    }
    if (!bVar3) {
      return UVar5;
    }
  }
  UVar5 = UnicodeFilter::matches(&this->super_UnicodeFilter,text,offset,limit,incremental);
  return UVar5;
}

Assistant:

UMatchDegree UnicodeSet::matches(const Replaceable& text,
                                 int32_t& offset,
                                 int32_t limit,
                                 UBool incremental) {
    if (offset == limit) {
        // Strings, if any, have length != 0, so we don't worry
        // about them here.  If we ever allow zero-length strings
        // we much check for them here.
        if (contains(U_ETHER)) {
            return incremental ? U_PARTIAL_MATCH : U_MATCH;
        } else {
            return U_MISMATCH;
        }
    } else {
        if (strings->size() != 0) { // try strings first

            // might separate forward and backward loops later
            // for now they are combined

            // TODO Improve efficiency of this, at least in the forward
            // direction, if not in both.  In the forward direction we
            // can assume the strings are sorted.

            int32_t i;
            UBool forward = offset < limit;

            // firstChar is the leftmost char to match in the
            // forward direction or the rightmost char to match in
            // the reverse direction.
            UChar firstChar = text.charAt(offset);

            // If there are multiple strings that can match we
            // return the longest match.
            int32_t highWaterLength = 0;

            for (i=0; i<strings->size(); ++i) {
                const UnicodeString& trial = *(const UnicodeString*)strings->elementAt(i);

                //if (trial.length() == 0) {
                //    return U_MATCH; // null-string always matches
                //}
                // assert(trial.length() != 0); // We ensure this elsewhere

                UChar c = trial.charAt(forward ? 0 : trial.length() - 1);

                // Strings are sorted, so we can optimize in the
                // forward direction.
                if (forward && c > firstChar) break;
                if (c != firstChar) continue;

                int32_t matchLen = matchRest(text, offset, limit, trial);

                if (incremental) {
                    int32_t maxLen = forward ? limit-offset : offset-limit;
                    if (matchLen == maxLen) {
                        // We have successfully matched but only up to limit.
                        return U_PARTIAL_MATCH;
                    }
                }

                if (matchLen == trial.length()) {
                    // We have successfully matched the whole string.
                    if (matchLen > highWaterLength) {
                        highWaterLength = matchLen;
                    }
                    // In the forward direction we know strings
                    // are sorted so we can bail early.
                    if (forward && matchLen < highWaterLength) {
                        break;
                    }
                    continue;
                }
            }

            // We've checked all strings without a partial match.
            // If we have full matches, return the longest one.
            if (highWaterLength != 0) {
                offset += forward ? highWaterLength : -highWaterLength;
                return U_MATCH;
            }
        }
        return UnicodeFilter::matches(text, offset, limit, incremental);
    }
}